

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fDebugTests.cpp
# Opt level: O1

void __thiscall
deqp::gles31::Functional::anon_unknown_1::FilterCase::callback
          (FilterCase *this,GLenum source,GLenum type,GLuint id,GLenum severity,string *message)

{
  pointer *ppMVar1;
  vector<deqp::gles31::Functional::(anonymous_namespace)::MessageData,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::MessageData>_>
  *pvVar2;
  pointer pcVar3;
  pointer pMVar4;
  pointer pMVar5;
  size_type sVar6;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar7;
  long lVar8;
  ulong uVar9;
  pointer pMVar10;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar11;
  size_type *psVar12;
  ulong uVar13;
  ulong uVar14;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar15;
  pointer pMVar16;
  _Alloc_hider local_50;
  size_type local_48;
  char local_40;
  undefined7 uStack_3f;
  size_type sStack_38;
  
  pvVar2 = this->m_currentErrors;
  if (pvVar2 != (vector<deqp::gles31::Functional::(anonymous_namespace)::MessageData,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::MessageData>_>
                 *)0x0) {
    pcVar3 = (message->_M_dataplus)._M_p;
    local_50._M_p = &local_40;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_50,pcVar3,pcVar3 + message->_M_string_length);
    pMVar4 = (pvVar2->
             super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::MessageData,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::MessageData>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    if (pMVar4 == (pvVar2->
                  super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::MessageData,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::MessageData>_>
                  )._M_impl.super__Vector_impl_data._M_end_of_storage) {
      pMVar5 = (pvVar2->
               super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::MessageData,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::MessageData>_>
               )._M_impl.super__Vector_impl_data._M_start;
      if ((long)pMVar4 - (long)pMVar5 == 0x7fffffffffffffe0) {
        std::__throw_length_error("vector::_M_realloc_insert");
      }
      lVar8 = (long)pMVar4 - (long)pMVar5 >> 4;
      uVar14 = lVar8 * -0x5555555555555555;
      uVar9 = 1;
      if (pMVar4 != pMVar5) {
        uVar9 = uVar14;
      }
      uVar13 = uVar9 + uVar14;
      if (0x2aaaaaaaaaaaaa9 < uVar13) {
        uVar13 = 0x2aaaaaaaaaaaaaa;
      }
      if (CARRY8(uVar9,uVar14)) {
        uVar13 = 0x2aaaaaaaaaaaaaa;
      }
      if (uVar13 == 0) {
        pMVar10 = (pointer)0x0;
      }
      else {
        pMVar10 = (pointer)operator_new(uVar13 * 0x30);
      }
      psVar12 = (size_type *)((long)&pMVar10->id + lVar8 * 0x10);
      *psVar12 = CONCAT44(type,source);
      psVar12[1] = CONCAT44(severity,id);
      psVar12[2] = (size_type)(psVar12 + 4);
      if (local_50._M_p == &local_40) {
        psVar12[4] = CONCAT71(uStack_3f,local_40);
        psVar12[5] = sStack_38;
      }
      else {
        (&(pMVar10->message)._M_dataplus)[lVar8 * 2]._M_p = local_50._M_p;
        (&(pMVar10->message).field_2)[lVar8]._M_allocated_capacity = CONCAT71(uStack_3f,local_40);
      }
      (&(pMVar10->message)._M_string_length)[lVar8 * 2] = local_48;
      local_48 = 0;
      local_40 = '\0';
      pMVar16 = pMVar10;
      if (pMVar4 != pMVar5) {
        paVar11 = &(pMVar5->message).field_2;
        paVar7 = &(pMVar10->message).field_2;
        do {
          paVar15 = paVar7;
          sVar6 = *(size_type *)((long)paVar11 + -0x18);
          (&paVar15->_M_allocated_capacity)[-4] = paVar11[-2]._M_allocated_capacity;
          (&paVar15->_M_allocated_capacity)[-3] = sVar6;
          (&paVar15->_M_allocated_capacity)[-2] = (size_type)paVar15;
          pcVar3 = (((string *)(paVar11 + -1))->_M_dataplus)._M_p;
          if (paVar11 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)pcVar3) {
            sVar6 = *(size_type *)((long)paVar11 + 8);
            paVar15->_M_allocated_capacity = paVar11->_M_allocated_capacity;
            (&paVar15->_M_allocated_capacity)[1] = sVar6;
          }
          else {
            (&paVar15->_M_allocated_capacity)[-2] = (size_type)pcVar3;
            paVar15->_M_allocated_capacity = paVar11->_M_allocated_capacity;
          }
          (&paVar15->_M_allocated_capacity)[-1] = *(size_type *)((long)paVar11 + -8);
          (((string *)(paVar11 + -1))->_M_dataplus)._M_p = (pointer)paVar11;
          *(size_type *)((long)paVar11 + -8) = 0;
          paVar11->_M_local_buf[0] = '\0';
          pMVar16 = (pointer)(paVar11 + 1);
          paVar11 = paVar11 + 3;
          paVar7 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)(&paVar15->_M_allocated_capacity + 6);
        } while (pMVar16 != pMVar4);
        pMVar16 = (pointer)(&paVar15->_M_allocated_capacity + 2);
      }
      local_50._M_p = &local_40;
      if (pMVar5 != (pointer)0x0) {
        operator_delete(pMVar5,(long)(pvVar2->
                                     super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::MessageData,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::MessageData>_>
                                     )._M_impl.super__Vector_impl_data._M_end_of_storage -
                               (long)pMVar5);
      }
      (pvVar2->
      super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::MessageData,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::MessageData>_>
      )._M_impl.super__Vector_impl_data._M_start = pMVar10;
      (pvVar2->
      super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::MessageData,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::MessageData>_>
      )._M_impl.super__Vector_impl_data._M_finish = pMVar16 + 1;
      (pvVar2->
      super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::MessageData,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::MessageData>_>
      )._M_impl.super__Vector_impl_data._M_end_of_storage = pMVar10 + uVar13;
    }
    else {
      (pMVar4->id).source = source;
      (pMVar4->id).type = type;
      *(ulong *)&(pMVar4->id).id = CONCAT44(severity,id);
      paVar11 = &(pMVar4->message).field_2;
      (pMVar4->message)._M_dataplus._M_p = (pointer)paVar11;
      if (local_50._M_p == &local_40) {
        paVar11->_M_allocated_capacity = CONCAT71(uStack_3f,local_40);
        *(size_type *)((long)&(pMVar4->message).field_2 + 8) = sStack_38;
      }
      else {
        (pMVar4->message)._M_dataplus._M_p = local_50._M_p;
        (pMVar4->message).field_2._M_allocated_capacity = CONCAT71(uStack_3f,local_40);
      }
      (pMVar4->message)._M_string_length = local_48;
      local_48 = 0;
      local_40 = '\0';
      ppMVar1 = &(pvVar2->
                 super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::MessageData,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::MessageData>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
      *ppMVar1 = *ppMVar1 + 1;
      local_50._M_p = &local_40;
    }
    if (local_50._M_p != &local_40) {
      operator_delete(local_50._M_p,CONCAT71(uStack_3f,local_40) + 1);
    }
  }
  return;
}

Assistant:

void FilterCase::callback (GLenum source, GLenum type, GLuint id, GLenum severity, const string& message)
{
	if (m_currentErrors)
		m_currentErrors->push_back(MessageData(MessageID(source, type, id), severity, message));
}